

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O0

TileCoord __thiscall Imf_3_4::TiledOutputFile::Data::nextTileCoord(Data *this,TileCoord *a)

{
  uint uVar1;
  TileCoord TVar2;
  ArgExc *pAVar3;
  undefined8 *in_RSI;
  long in_RDI;
  TileCoord b;
  int local_10;
  int iStack_c;
  int local_8;
  int iStack_4;
  
  local_10 = (int)*in_RSI;
  iStack_c = (int)((ulong)*in_RSI >> 0x20);
  local_8 = (int)in_RSI[1];
  iStack_4 = (int)((ulong)in_RSI[1] >> 0x20);
  if (*(int *)(in_RDI + 0x88) == 0) {
    local_10 = local_10 + 1;
    if (*(int *)(*(long *)(in_RDI + 0xa8) + (long)local_8 * 4) <= local_10) {
      local_10 = 0;
      iStack_c = iStack_c + 1;
      if (*(int *)(*(long *)(in_RDI + 0xb0) + (long)iStack_4 * 4) <= iStack_c) {
        iStack_c = 0;
        uVar1 = *(uint *)(in_RDI + 0x48);
        if (uVar1 < 2) {
          local_8 = local_8 + 1;
          iStack_4 = iStack_4 + 1;
        }
        else if (uVar1 == 2) {
          local_8 = local_8 + 1;
          if (*(int *)(in_RDI + 0x9c) <= local_8) {
            local_8 = 0;
            iStack_4 = iStack_4 + 1;
          }
        }
        else if (uVar1 == 3) {
          pAVar3 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_3_4::ArgExc::ArgExc(pAVar3,"Invalid tile description");
          __cxa_throw(pAVar3,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
        }
      }
    }
  }
  else if ((*(int *)(in_RDI + 0x88) == 1) &&
          (local_10 = local_10 + 1,
          *(int *)(*(long *)(in_RDI + 0xa8) + (long)local_8 * 4) <= local_10)) {
    local_10 = 0;
    iStack_c = iStack_c + -1;
    if (iStack_c < 0) {
      uVar1 = *(uint *)(in_RDI + 0x48);
      if (uVar1 < 2) {
        local_8 = local_8 + 1;
        iStack_4 = iStack_4 + 1;
      }
      else if (uVar1 == 2) {
        local_8 = local_8 + 1;
        if (*(int *)(in_RDI + 0x9c) <= local_8) {
          local_8 = 0;
          iStack_4 = iStack_4 + 1;
        }
      }
      else if (uVar1 == 3) {
        pAVar3 = (ArgExc *)__cxa_allocate_exception(0x48);
        Iex_3_4::ArgExc::ArgExc(pAVar3,"Invalid tile description");
        __cxa_throw(pAVar3,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
      }
      if (iStack_4 < *(int *)(in_RDI + 0xa0)) {
        iStack_c = *(int *)(*(long *)(in_RDI + 0xb0) + (long)iStack_4 * 4) + -1;
      }
    }
  }
  TVar2.dy = iStack_c;
  TVar2.dx = local_10;
  TVar2.lx = local_8;
  TVar2.ly = iStack_4;
  return TVar2;
}

Assistant:

TileCoord
TiledOutputFile::Data::nextTileCoord (const TileCoord& a)
{
    TileCoord b = a;

    if (lineOrder == INCREASING_Y)
    {
        b.dx++;

        if (b.dx >= numXTiles[b.lx])
        {
            b.dx = 0;
            b.dy++;

            if (b.dy >= numYTiles[b.ly])
            {
                //
                // the next tile is in the next level
                //

                b.dy = 0;

                switch (tileDesc.mode)
                {
                    case ONE_LEVEL:
                    case MIPMAP_LEVELS:

                        b.lx++;
                        b.ly++;
                        break;

                    case RIPMAP_LEVELS:

                        b.lx++;

                        if (b.lx >= numXLevels)
                        {
                            b.lx = 0;
                            b.ly++;

#ifdef DEBUG
                            assert (b.ly <= numYLevels);
#endif
                        }
                        break;
                    case NUM_LEVELMODES:
                        throw (
                            IEX_NAMESPACE::ArgExc ("Invalid tile description"));
                }
            }
        }
    }
    else if (lineOrder == DECREASING_Y)
    {
        b.dx++;

        if (b.dx >= numXTiles[b.lx])
        {
            b.dx = 0;
            b.dy--;

            if (b.dy < 0)
            {
                //
                // the next tile is in the next level
                //

                switch (tileDesc.mode)
                {
                    case ONE_LEVEL:
                    case MIPMAP_LEVELS:

                        b.lx++;
                        b.ly++;
                        break;

                    case RIPMAP_LEVELS:

                        b.lx++;

                        if (b.lx >= numXLevels)
                        {
                            b.lx = 0;
                            b.ly++;

#ifdef DEBUG
                            assert (b.ly <= numYLevels);
#endif
                        }
                        break;
                    case NUM_LEVELMODES:
                        throw (
                            IEX_NAMESPACE::ArgExc ("Invalid tile description"));
                }

                if (b.ly < numYLevels) b.dy = numYTiles[b.ly] - 1;
            }
        }
    }

    return b;
}